

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_test.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  value *pvVar2;
  bool *pbVar3;
  undefined8 uVar4;
  char *pcVar5;
  service srv;
  service asStack_68 [8];
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  undefined1 local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  undefined1 local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  cppcms::service::service(asStack_68,argc,argv);
  pvVar2 = (value *)cppcms::service::settings();
  cppcms::json::value::get_abi_cxx11_((string *)local_60,pvVar2,"test.async","sync");
  iVar1 = std::__cxx11::string::compare(local_60);
  if ((undefined1 *)local_60._0_8_ != local_50) {
    operator_delete((void *)local_60._0_8_);
  }
  if (iVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Synchronous testing",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
    uVar4 = cppcms::service::applications_pool();
    cppcms::create_pool<unit_test>();
    cppcms::applications_pool::mount(uVar4,local_30,0);
    local_38 = local_28;
  }
  else {
    pvVar2 = (value *)cppcms::service::settings();
    cppcms::json::value::get<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,pvVar2,
               "test.async");
    iVar1 = std::__cxx11::string::compare(local_60);
    if ((undefined1 *)local_60._0_8_ != local_50) {
      operator_delete((void *)local_60._0_8_);
    }
    if (iVar1 == 0) {
      pcVar5 = "Asynchronous testing";
      pbVar3 = &is_async;
    }
    else {
      pvVar2 = (value *)cppcms::service::settings();
      cppcms::json::value::get<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                 pvVar2,"test.async");
      iVar1 = std::__cxx11::string::compare(local_60);
      if ((undefined1 *)local_60._0_8_ != local_50) {
        operator_delete((void *)local_60._0_8_);
      }
      if (iVar1 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Invalid configuration value of test.async",0x29);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
        std::ostream::put('0');
        std::ostream::flush();
        cppcms::service::~service(asStack_68);
        return 1;
      }
      is_async = true;
      pcVar5 = "Non blocking testing";
      pbVar3 = &is_nonblocking;
    }
    *pbVar3 = true;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
    uVar4 = cppcms::service::applications_pool();
    cppcms::create_pool<unit_test>();
    cppcms::applications_pool::mount(uVar4,local_40,1);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  local_60._8_8_ = 0;
  local_50._8_8_ = std::_Function_handler<void_(),_submitter>::_M_invoke;
  local_50._0_8_ = std::_Function_handler<void_(),_submitter>::_M_manager;
  local_60._0_8_ = asStack_68;
  cppcms::service::after_fork((function *)asStack_68);
  if ((code *)local_50._0_8_ != (code *)0x0) {
    (*(code *)local_50._0_8_)(local_60,local_60,3);
  }
  cppcms::service::run();
  cppcms::service::~service(asStack_68);
  return run_ok ^ 1;
}

Assistant:

int main(int argc,char **argv)
{
	try {
		cppcms::service srv(argc,argv);
		if(srv.settings().get("test.async","sync")=="sync") {
			std::cout << "Synchronous testing" << std::endl;
			srv.applications_pool().mount( cppcms::create_pool<unit_test>());
		}
		else {
			if(srv.settings().get<std::string>("test.async")=="async") {
				is_async = true;
				std::cout << "Asynchronous testing" << std::endl;
			}
			else if(srv.settings().get<std::string>("test.async")=="nonblocking") {
				is_async = true;
				is_nonblocking = true;
				std::cout << "Non blocking testing" << std::endl;
			}
			else {
				std::cerr << "Invalid configuration value of test.async" << std::endl;
				return 1;
			}
			srv.applications_pool().mount( cppcms::create_pool<unit_test>(),cppcms::app::asynchronous);
		}
		srv.after_fork(submitter(srv));
		srv.run();
	}
	catch(std::exception const &e) {
		std::cerr << e.what() << std::endl;
		return EXIT_FAILURE;
	}
	return run_ok ? EXIT_SUCCESS : EXIT_FAILURE;
}